

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageImage(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  DefUseManager *pDVar4;
  Instruction *local_28;
  Instruction *base_type;
  StorageClass storage_class;
  Instruction *this_local;
  
  OVar1 = opcode(this);
  if (OVar1 != OpTypePointer) {
    return false;
  }
  uVar2 = GetSingleWordInOperand(this,0);
  if (uVar2 == 0) {
    pIVar3 = context(this);
    pDVar4 = IRContext::get_def_use_mgr(pIVar3);
    uVar2 = GetSingleWordInOperand(this,1);
    local_28 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    OVar1 = opcode(local_28);
    if ((OVar1 == OpTypeArray) || (OVar1 = opcode(local_28), OVar1 == OpTypeRuntimeArray)) {
      pIVar3 = context(this);
      pDVar4 = IRContext::get_def_use_mgr(pIVar3);
      uVar2 = GetSingleWordInOperand(local_28,0);
      local_28 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    }
    OVar1 = opcode(local_28);
    if (OVar1 == OpTypeImage) {
      uVar2 = GetSingleWordInOperand(local_28,1);
      if (uVar2 == 5) {
        this_local._7_1_ = false;
      }
      else {
        uVar2 = GetSingleWordInOperand(local_28,5);
        this_local._7_1_ = uVar2 != 1;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageImage() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::UniformConstant) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeImage) {
    return false;
  }

  if (spv::Dim(base_type->GetSingleWordInOperand(kTypeImageDimIndex)) ==
      spv::Dim::Buffer) {
    return false;
  }

  // Check if the image is sampled.  If we do not know for sure that it is,
  // then assume it is a storage image.
  return base_type->GetSingleWordInOperand(kTypeImageSampledIndex) != 1;
}